

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

ssize_t __thiscall tcu::LogImage::write(LogImage *this,int __fd,void *__buf,size_t __n)

{
  ConstPixelBufferAccess *access;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  TestLog *this_00;
  Vec4 local_a8;
  Vec4 local_98;
  ConstPixelBufferAccess stencilAccess;
  ConstPixelBufferAccess depthAccess;
  
  this_00 = (TestLog *)CONCAT44(in_register_00000034,__fd);
  access = &this->m_access;
  if ((this->m_access).m_format.order == DS) {
    getEffectiveDepthStencilAccess(&depthAccess,access,MODE_DEPTH);
    getEffectiveDepthStencilAccess(&stencilAccess,access,MODE_STENCIL);
    TestLog::startImageSet
              (this_00,(this->m_name)._M_dataplus._M_p,(this->m_description)._M_dataplus._M_p);
    local_98.m_data[0] = (this->m_scale).m_data[0];
    local_a8.m_data[0] = (this->m_bias).m_data[0];
    local_a8.m_data[1] = local_a8.m_data[0];
    local_a8.m_data[2] = local_a8.m_data[0];
    local_a8.m_data[3] = local_a8.m_data[0];
    local_98.m_data[1] = local_98.m_data[0];
    local_98.m_data[2] = local_98.m_data[0];
    local_98.m_data[3] = local_98.m_data[0];
    TestLog::writeImage(this_00,"Depth","Depth channel",&depthAccess,&local_98,&local_a8,
                        this->m_compression);
    local_98.m_data[0] = (this->m_scale).m_data[1];
    local_a8.m_data[0] = (this->m_bias).m_data[1];
    local_a8.m_data[1] = local_a8.m_data[0];
    local_a8.m_data[2] = local_a8.m_data[0];
    local_a8.m_data[3] = local_a8.m_data[0];
    local_98.m_data[1] = local_98.m_data[0];
    local_98.m_data[2] = local_98.m_data[0];
    local_98.m_data[3] = local_98.m_data[0];
    TestLog::writeImage(this_00,"Stencil","Stencil channel",&stencilAccess,&local_98,&local_a8,
                        this->m_compression);
    TestLog::endImageSet(this_00);
    sVar1 = extraout_RAX;
  }
  else {
    TestLog::writeImage(this_00,(this->m_name)._M_dataplus._M_p,
                        (this->m_description)._M_dataplus._M_p,access,&this->m_scale,&this->m_bias,
                        this->m_compression);
    sVar1 = extraout_RAX_00;
  }
  return sVar1;
}

Assistant:

void LogImage::write (TestLog& log) const
{
	if (m_access.getFormat().order != tcu::TextureFormat::DS)
		log.writeImage(m_name.c_str(), m_description.c_str(), m_access, m_scale, m_bias, m_compression);
	else
	{
		const ConstPixelBufferAccess	depthAccess		= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	stencilAccess	= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);

		log.startImageSet(m_name.c_str(), m_description.c_str());
		log.writeImage("Depth", "Depth channel", depthAccess, m_scale.swizzle(0, 0, 0, 0), m_bias.swizzle(0, 0, 0, 0), m_compression);
		log.writeImage("Stencil", "Stencil channel", stencilAccess, m_scale.swizzle(1, 1, 1, 1), m_bias.swizzle(1, 1, 1, 1), m_compression);
		log.endImageSet();
	}
}